

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,BaseTextGenerator *generator,
          int recursion_budget)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  const_reference this_00;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  UnknownFieldSet *unknown_fields_00;
  undefined4 in_register_0000000c;
  char *pcVar6;
  int index;
  string_view sVar7;
  string_view src;
  undefined8 uStack_d0;
  UnknownFieldSet embedded_unknown_fields;
  CodedInputStream local_a8;
  undefined8 local_58;
  string local_50;
  
  local_58 = CONCAT44(in_register_0000000c,recursion_budget);
  index = 0;
  do {
    iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
    if (iVar2 <= index) {
      return;
    }
    this_00 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
    switch(this_00->type_) {
    case 0:
      local_a8.buffer_ = (uint8_t *)CONCAT44(local_a8.buffer_._4_4_,this_00->number_);
      OutOfLinePrintString<int>(generator,(int *)&local_a8);
      (*generator->_vptr_BaseTextGenerator[6])(generator,2,": ");
      if (this->redact_debug_string_ == true) {
        OutOfLinePrintString<char[16]>(generator,(char (*) [16])"UNKNOWN_VARINT ");
        goto LAB_0026a1a2;
      }
      local_a8.buffer_ = (uint8_t *)UnknownField::varint(this_00);
      OutOfLinePrintString<unsigned_long>(generator,(unsigned_long *)&local_a8);
      goto LAB_0026a2cb;
    case 1:
      local_a8.buffer_ = (uint8_t *)CONCAT44(local_a8.buffer_._4_4_,this_00->number_);
      OutOfLinePrintString<int>(generator,(int *)&local_a8);
      p_Var4 = generator->_vptr_BaseTextGenerator[7];
      if (this->redact_debug_string_ != true) {
        (*p_Var4)(generator,2,": ",2,"0x");
        uVar3 = UnknownField::fixed32(this_00);
        local_a8.buffer_ = (uint8_t *)(ulong)uVar3;
        local_a8.buffer_end_ = (uint8_t *)CONCAT62(local_a8.buffer_end_._2_6_,0x3008);
LAB_0026a2c0:
        OutOfLinePrintString<absl::lts_20250127::Hex>(generator,(Hex *)&local_a8);
        goto LAB_0026a2cb;
      }
      pcVar6 = "UNKNOWN_FIXED32 ";
      goto LAB_0026a1a0;
    case 2:
      local_a8.buffer_ = (uint8_t *)CONCAT44(local_a8.buffer_._4_4_,this_00->number_);
      OutOfLinePrintString<int>(generator,(int *)&local_a8);
      p_Var4 = generator->_vptr_BaseTextGenerator[7];
      if (this->redact_debug_string_ != true) {
        (*p_Var4)(generator,2,": ",2,"0x");
        local_a8.buffer_ = (uint8_t *)UnknownField::fixed64(this_00);
        local_a8.buffer_end_ = (uint8_t *)CONCAT62(local_a8.buffer_end_._2_6_,0x3010);
        goto LAB_0026a2c0;
      }
      pcVar6 = "UNKNOWN_FIXED64 ";
LAB_0026a1a0:
      (*p_Var4)(generator,2,": ",0x10,pcVar6);
LAB_0026a1a2:
      OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                (generator,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 protobuf::(anonymous_namespace)::kFieldValueReplacement);
LAB_0026a2cb:
      if (this->single_line_mode_ == true) {
        pcVar6 = " ";
      }
      else {
        pcVar6 = "\n";
      }
      (*generator->_vptr_BaseTextGenerator[5])(generator,pcVar6,1);
      break;
    case 3:
      local_a8.buffer_ = (uint8_t *)CONCAT44(local_a8.buffer_._4_4_,this_00->number_);
      OutOfLinePrintString<int>(generator,(int *)&local_a8);
      sVar7 = UnknownField::length_delimited(this_00);
      src._M_len = (uint8_t *)sVar7._M_str;
      local_a8.total_bytes_read_ = (int)sVar7._M_len;
      local_a8.buffer_end_ = src._M_len + local_a8.total_bytes_read_;
      local_a8.input_ = (ZeroCopyInputStream *)0x0;
      local_a8._28_7_ = 0;
      local_a8._35_4_ = 0;
      local_a8.buffer_size_after_limit_ = 0;
      local_a8.total_bytes_limit_ = 0x7fffffff;
      local_a8.extension_pool_ = (DescriptorPool *)0x0;
      local_a8.extension_factory_ = (MessageFactory *)0x0;
      local_a8.recursion_budget_ = (int)local_58;
      embedded_unknown_fields.fields_.soo_rep_.field_0.long_rep.elements_int = 0;
      embedded_unknown_fields.fields_.soo_rep_.field_0.short_rep.field_1 =
           (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      local_a8.buffer_ = src._M_len;
      local_a8.current_limit_ = local_a8.total_bytes_read_;
      local_a8.recursion_limit_ = local_a8.recursion_budget_;
      if (((local_a8.recursion_budget_ < 1) || ((lts_20250127 *)sVar7._M_len == (lts_20250127 *)0x0)
          ) || (bVar1 = UnknownFieldSet::ParseFromCodedStream(&embedded_unknown_fields,&local_a8),
               !bVar1)) {
        if (this->redact_debug_string_ != true) {
          pcVar6 = (char *)0x1;
          (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",1,"\"");
          src._M_str = pcVar6;
          absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)sVar7._M_len,src);
          (*generator->_vptr_BaseTextGenerator[5])
                    (generator,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__cxx11::string::~string((string *)&local_50);
          pp_Var5 = generator->_vptr_BaseTextGenerator + 5;
          pcVar6 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar6 = "\" ";
          }
          goto LAB_0026a362;
        }
        (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0xf,"UNKNOWN_STRING ");
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (generator,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   protobuf::(anonymous_namespace)::kFieldValueReplacement);
LAB_0026a1f1:
        pp_Var5 = generator->_vptr_BaseTextGenerator + 5;
        pcVar6 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar6 = " ";
        }
        uStack_d0 = 1;
      }
      else {
        if (this->redact_debug_string_ == true) {
          (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0x10,"UNKNOWN_MESSAGE ");
          OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                    (generator,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     protobuf::(anonymous_namespace)::kFieldValueReplacement);
          goto LAB_0026a1f1;
        }
        if (this->single_line_mode_ == true) {
          (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{ ");
        }
        else {
          (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{\n");
          (*generator->_vptr_BaseTextGenerator[2])(generator);
        }
        PrintUnknownFields(this,&embedded_unknown_fields,generator,recursion_budget + -1);
        if (this->single_line_mode_ == true) {
          pp_Var5 = generator->_vptr_BaseTextGenerator + 5;
          pcVar6 = "} ";
        }
        else {
          (*generator->_vptr_BaseTextGenerator[3])(generator);
          pp_Var5 = generator->_vptr_BaseTextGenerator + 5;
          pcVar6 = "}\n";
        }
LAB_0026a362:
        uStack_d0 = 2;
      }
      (**pp_Var5)(generator,pcVar6,uStack_d0);
      UnknownFieldSet::~UnknownFieldSet(&embedded_unknown_fields);
      io::CodedInputStream::~CodedInputStream(&local_a8);
      break;
    case 4:
      local_a8.buffer_ = (uint8_t *)CONCAT44(local_a8.buffer_._4_4_,this_00->number_);
      OutOfLinePrintString<int>(generator,(int *)&local_a8);
      if (this->redact_debug_string_ == true) {
        (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0xe,"UNKNOWN_GROUP ");
        goto LAB_0026a1a2;
      }
      if (this->single_line_mode_ == true) {
        (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{ ");
      }
      else {
        (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{\n");
        (*generator->_vptr_BaseTextGenerator[2])(generator);
      }
      unknown_fields_00 = UnknownField::group(this_00);
      PrintUnknownFields(this,unknown_fields_00,generator,recursion_budget + -1);
      pp_Var5 = generator->_vptr_BaseTextGenerator;
      if (this->single_line_mode_ == true) {
        pcVar6 = "} ";
      }
      else {
        (*pp_Var5[3])(generator);
        pp_Var5 = generator->_vptr_BaseTextGenerator;
        pcVar6 = "}\n";
      }
      (*pp_Var5[5])(generator,pcVar6,2);
    }
    index = index + 1;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, BaseTextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        OutOfLinePrintString(generator, field.number());
        generator->PrintMaybeWithMarker(MarkerToken(), ": ");
        if (redact_debug_string_) {
          OutOfLinePrintString(generator, "UNKNOWN_VARINT ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          OutOfLinePrintString(generator, field.varint());
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED32 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed32(), absl::kZeroPad8));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED64 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed64(), absl::kZeroPad16));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        OutOfLinePrintString(generator, field.number());
        const absl::string_view value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_MESSAGE ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_STRING ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "\"");
          generator->PrintString(absl::CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_GROUP ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
          if (single_line_mode_) {
            generator->PrintLiteral(" ");
          } else {
            generator->PrintLiteral("\n");
          }
          break;
        }
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}